

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O0

EStatusCode __thiscall
WrittenFontTrueType::WriteState
          (WrittenFontTrueType *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  DictionaryContext *pDVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  DictionaryContext *local_38;
  DictionaryContext *writtenFontDictionary;
  ObjectIDType OStack_28;
  EStatusCode status;
  ObjectIDType inObjectID_local;
  ObjectsContext *inStateWriter_local;
  WrittenFontTrueType *this_local;
  
  OStack_28 = inObjectID;
  inObjectID_local = (ObjectIDType)inStateWriter;
  inStateWriter_local = (ObjectsContext *)this;
  writtenFontDictionary._4_4_ = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  this_local._4_4_ = writtenFontDictionary._4_4_;
  if (writtenFontDictionary._4_4_ == eSuccess) {
    pDVar1 = ObjectsContext::StartDictionary((ObjectsContext *)inObjectID_local);
    local_38 = pDVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Type",&local_59);
    DictionaryContext::WriteKey(pDVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"WrittenFontTrueType",&local_91);
    DictionaryContext::WriteNameValue(pDVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    writtenFontDictionary._4_4_ =
         AbstractWrittenFont::WriteStateInDictionary
                   (&this->super_AbstractWrittenFont,(ObjectsContext *)inObjectID_local,local_38);
    if (writtenFontDictionary._4_4_ == eSuccess) {
      ObjectsContext::EndDictionary((ObjectsContext *)inObjectID_local,local_38);
      ObjectsContext::EndIndirectObject((ObjectsContext *)inObjectID_local);
      writtenFontDictionary._4_4_ =
           AbstractWrittenFont::WriteStateAfterDictionary
                     (&this->super_AbstractWrittenFont,(ObjectsContext *)inObjectID_local);
    }
    this_local._4_4_ = writtenFontDictionary._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode WrittenFontTrueType::WriteState(ObjectsContext* inStateWriter,ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != PDFHummus::eSuccess)
		return status;

	DictionaryContext* writtenFontDictionary = inStateWriter->StartDictionary();

	writtenFontDictionary->WriteKey("Type");
	writtenFontDictionary->WriteNameValue("WrittenFontTrueType");

	status = AbstractWrittenFont::WriteStateInDictionary(inStateWriter,writtenFontDictionary);
	if(PDFHummus::eSuccess == status)
	{
		inStateWriter->EndDictionary(writtenFontDictionary);
		inStateWriter->EndIndirectObject();

		status = AbstractWrittenFont::WriteStateAfterDictionary(inStateWriter);
	}
	return status;
}